

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

span<const_slang::parsing::Trivia,_18446744073709551615UL> __thiscall
slang::parsing::Token::trivia(Token *this)

{
  byte *__count;
  size_t sVar1;
  Trivia *in_RDI;
  size_t size;
  byte *ptr;
  Trivia *trivia;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *in_stack_ffffffffffffffd0;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_10;
  
  if ((*(byte *)((long)&in_RDI->field_0 + 2) >> 1 & 0xf) == 0) {
    std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x64a9bc);
  }
  else {
    __count = Info::extra(*(Info **)((long)&in_RDI->field_0 + 8));
    sVar1 = getExtraSize(*(TokenKind *)&in_RDI->field_0);
    if ((*(byte *)((long)&in_RDI->field_0 + 2) >> 1 & 0xf) == 0xf) {
      std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
      span<const_slang::parsing::Trivia_*>
                (*(span<const_slang::parsing::Trivia,_18446744073709551615UL> **)
                  (__count + sVar1 + 8),in_RDI,(size_type)__count);
    }
    else {
      std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
      span<const_slang::parsing::Trivia_*>(in_stack_ffffffffffffffd0,in_RDI,(size_type)__count);
    }
  }
  return local_10;
}

Assistant:

std::span<Trivia const> Token::trivia() const {
    if (triviaCountSmall == 0)
        return {};

    const Trivia* trivia;
    byte* ptr = info->extra() + getExtraSize(kind);
    memcpy(reinterpret_cast<void*>(&trivia), ptr, sizeof(trivia));

    if (triviaCountSmall == MaxTriviaSmallCount + 1) {
        size_t size;
        memcpy(&size, ptr + sizeof(trivia), sizeof(size_t));
        return {trivia, size};
    }

    return {trivia, triviaCountSmall};
}